

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

void __thiscall pybind11::list::append<char_const(&)[2]>(list *this,char (*val) [2])

{
  PyObject *pPVar1;
  handle in_RAX;
  object local_18;
  
  pPVar1 = (this->super_object).super_handle.m_ptr;
  local_18.super_handle.m_ptr = (handle)(handle)in_RAX.m_ptr;
  detail::object_or_cast<const_char_(&)[2],_0>((detail *)&local_18,val);
  PyList_Append(pPVar1,local_18.super_handle.m_ptr);
  object::~object(&local_18);
  return;
}

Assistant:

void append(T &&val) const {
        PyList_Append(m_ptr, detail::object_or_cast(std::forward<T>(val)).ptr());
    }